

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeAsyncHandler.hpp
# Opt level: O0

void __thiscall
ableton::util::SafeAsyncHandler<ableton::discovery::Socket<512ul>::Impl>::operator()
          (void *this,error_code *t,unsigned_long *t_1)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_30 [8];
  shared_ptr<ableton::discovery::Socket<512UL>::Impl> pDelegate;
  unsigned_long *t_local_1;
  error_code *t_local;
  SafeAsyncHandler<ableton::discovery::Socket<512UL>::Impl> *this_local;
  
  pDelegate.super___shared_ptr<ableton::discovery::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_1;
  std::weak_ptr<ableton::discovery::Socket<512UL>::Impl>::lock
            ((weak_ptr<ableton::discovery::Socket<512UL>::Impl> *)local_30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<ableton::discovery::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<ableton::discovery::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    discovery::Socket<512UL>::Impl::operator()
              (this_00,t,
               (size_t)(pDelegate.
                        super___shared_ptr<ableton::discovery::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_vptr__Sp_counted_base);
  }
  std::shared_ptr<ableton::discovery::Socket<512UL>::Impl>::~shared_ptr
            ((shared_ptr<ableton::discovery::Socket<512UL>::Impl> *)local_30);
  return;
}

Assistant:

void operator()(T&&... t) const
  {
    std::shared_ptr<Delegate> pDelegate = mpDelegate.lock();
    if (pDelegate)
    {
      (*pDelegate)(std::forward<T>(t)...);
    }
  }